

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_mconfig.cpp
# Opt level: O2

void test_save_and_load<QDateTime>(QDateTime *userValue)

{
  Format local_cc;
  QArrayDataPointer<char16_t> local_c8;
  SimpleConfig<QDateTime> config2;
  SimpleConfig<QDateTime> config1;
  
  SimpleConfig<QDateTime>::SimpleConfig(&config1);
  QDateTime::operator=(&config1.value,userValue);
  config2.super_MConfig.super_MBaseConfig.m_groupName.d.ptr = (char *)0x0;
  config2.super_MConfig.super_MBaseConfig._vptr_MBaseConfig = (_func_int **)0x0;
  config2.super_MConfig.super_MBaseConfig.m_groupName.d.d = (Data *)0x0;
  local_c8.d = (Data *)CONCAT44(local_c8.d._4_4_,1);
  MBaseConfig::save((MBaseConfig *)&config1,(QString *)&config2,(Format *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&config2);
  SimpleConfig<QDateTime>::SimpleConfig(&config2);
  local_c8.size = 0;
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_cc = IniFormat;
  MBaseConfig::load((MBaseConfig *)&config2,(QString *)&local_c8,&local_cc);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QTest::qCompare<QDateTime,QDateTime>
            (&config1.value,&config2.value,"config1.value","config2.value",
             "/workspace/llm4binary/github/license_all_cmakelists_25/milosolutions[P]mconfig/tst_mconfig/tst_mconfig.cpp"
             ,0x5b);
  SimpleConfig<QDateTime>::~SimpleConfig(&config2);
  SimpleConfig<QDateTime>::~SimpleConfig(&config1);
  return;
}

Assistant:

void test_save_and_load(T userValue)
{
    SimpleConfig<T> config1;
    config1.value = userValue;
    config1.save();
    SimpleConfig<T> config2;
    config2.load();
    QCOMPARE(config1.value, config2.value);
}